

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O3

bool __thiscall bssl::NameConstraints::IsPermittedDNSName(NameConstraints *this,string_view name)

{
  string_view *psVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> *excluded_name;
  string_view *psVar3;
  
  psVar1 = (this->excluded_subtrees_).dns_names.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->excluded_subtrees_).dns_names.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1;
      psVar3 = (string_view *)((long)psVar3 + 0x10)) {
    bVar2 = anon_unknown_0::DNSNameMatches(name,*psVar3,WILDCARD_PARTIAL_MATCH);
    if (bVar2) {
      return false;
    }
  }
  bVar2 = true;
  if (((this->permitted_subtrees_).present_name_types & 4) != 0) {
    psVar3 = (this->permitted_subtrees_).dns_names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->permitted_subtrees_).dns_names.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar3 == psVar1) {
      bVar2 = false;
    }
    else {
      do {
        bVar2 = anon_unknown_0::DNSNameMatches(name,*psVar3,WILDCARD_FULL_MATCH);
        if (bVar2) {
          return bVar2;
        }
        psVar3 = psVar3 + 1;
      } while (psVar3 != psVar1);
    }
  }
  return bVar2;
}

Assistant:

bool NameConstraints::IsPermittedDNSName(std::string_view name) const {
  for (const auto &excluded_name : excluded_subtrees_.dns_names) {
    // When matching wildcard hosts against excluded subtrees, consider it a
    // match if the constraint would match any expansion of the wildcard. Eg,
    // *.bar.com should match a constraint of foo.bar.com.
    if (DNSNameMatches(name, excluded_name, WILDCARD_PARTIAL_MATCH)) {
      return false;
    }
  }

  // If permitted subtrees are not constrained, any name that is not excluded is
  // allowed.
  if (!(permitted_subtrees_.present_name_types & GENERAL_NAME_DNS_NAME)) {
    return true;
  }

  for (const auto &permitted_name : permitted_subtrees_.dns_names) {
    // When matching wildcard hosts against permitted subtrees, consider it a
    // match only if the constraint would match all expansions of the wildcard.
    // Eg, *.bar.com should match a constraint of bar.com, but not foo.bar.com.
    if (DNSNameMatches(name, permitted_name, WILDCARD_FULL_MATCH)) {
      return true;
    }
  }

  return false;
}